

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcases.c
# Opt level: O1

void json2map_hookMethod(void *data,char *key,char *value)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = (char *)((long)data + -0xff);
  do {
    pcVar2 = pcVar1;
    pcVar1 = pcVar2 + 0x1fe;
  } while (pcVar2[0xff] != '\0');
  strcpy(pcVar2 + 0xff,key);
  strcpy(pcVar2 + 0x1fe,value);
  return;
}

Assistant:

void json2map_hookMethod(void *data, char *key, char *value) {
	int i;
	keyvalue_t *list = (keyvalue_t *) data;

	i = 0;
	while ( strcmp(list->key, "") ) {
		i++;
		list++;
	}
	strcpy(list->key, key);
	strcpy(list->value, value);
}